

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::UnicodeSet::complementAll(UnicodeSet *this,UnicodeSet *c)

{
  UBool UVar1;
  UnicodeString *s;
  int32_t i;
  int index;
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    exclusiveOr(this,c->list,c->len,'\0');
    for (index = 0; index < c->strings->count; index = index + 1) {
      s = (UnicodeString *)UVector::elementAt(c->strings,index);
      UVar1 = UVector::removeElement(this->strings,s);
      if (UVar1 == '\0') {
        _add(this,s);
      }
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complementAll(const UnicodeSet& c) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    exclusiveOr(c.list, c.len, 0);

    for (int32_t i=0; i<c.strings->size(); ++i) {
        void* e = c.strings->elementAt(i);
        if (!strings->removeElement(e)) {
            _add(*(const UnicodeString*)e);
        }
    }
    return *this;
}